

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CollectiveDipoleDisplacement.cpp
# Opt level: O1

Vector3d * __thiscall
OpenMD::CollectiveDipoleDisplacement::calcCorrVal
          (Vector3d *__return_storage_ptr__,CollectiveDipoleDisplacement *this,int frame1,int frame2
          )

{
  double dVar1;
  pointer pVVar2;
  long lVar3;
  uint i_2;
  double tmp;
  double dVar4;
  double tmp_1;
  double dVar5;
  double tmp_2;
  double dVar6;
  Vector<double,_3U> result;
  Vector3d diff;
  
  lVar3 = 0;
  pVVar2 = (this->CRcm_).
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  result.data_[2] = 0.0;
  result.data_[0] = 0.0;
  result.data_[1] = 0.0;
  do {
    result.data_[lVar3] =
         pVVar2[frame2].super_Vector<double,_3U>.data_[lVar3] -
         pVVar2[frame1].super_Vector<double,_3U>.data_[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  diff.super_Vector<double,_3U>.data_[2] = result.data_[2];
  diff.super_Vector<double,_3U>.data_[0] = result.data_[0];
  diff.super_Vector<double,_3U>.data_[1] = result.data_[1];
  dVar4 = 0.0;
  lVar3 = 0;
  do {
    dVar5 = diff.super_Vector<double,_3U>.data_[lVar3];
    dVar4 = dVar4 + dVar5 * dVar5;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  pVVar2 = (this->CRtot_).
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  result.data_[0] = 0.0;
  result.data_[1] = 0.0;
  result.data_[2] = 0.0;
  lVar3 = 0;
  do {
    result.data_[lVar3] =
         pVVar2[frame2].super_Vector<double,_3U>.data_[lVar3] -
         pVVar2[frame1].super_Vector<double,_3U>.data_[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  diff.super_Vector<double,_3U>.data_[2] = result.data_[2];
  diff.super_Vector<double,_3U>.data_[0] = result.data_[0];
  diff.super_Vector<double,_3U>.data_[1] = result.data_[1];
  dVar5 = 0.0;
  lVar3 = 0;
  do {
    dVar6 = diff.super_Vector<double,_3U>.data_[lVar3];
    dVar5 = dVar5 + dVar6 * dVar6;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  pVVar2 = (this->CRrot_).
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  result.data_[0] = 0.0;
  result.data_[1] = 0.0;
  result.data_[2] = 0.0;
  lVar3 = 0;
  do {
    result.data_[lVar3] =
         pVVar2[frame2].super_Vector<double,_3U>.data_[lVar3] -
         pVVar2[frame1].super_Vector<double,_3U>.data_[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  diff.super_Vector<double,_3U>.data_[2] = result.data_[2];
  diff.super_Vector<double,_3U>.data_[0] = result.data_[0];
  diff.super_Vector<double,_3U>.data_[1] = result.data_[1];
  dVar6 = 0.0;
  lVar3 = 0;
  do {
    dVar1 = diff.super_Vector<double,_3U>.data_[lVar3];
    dVar6 = dVar6 + dVar1 * dVar1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[0] = 0.0;
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[1] = 0.0;
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[0] = dVar4;
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[1] = dVar5;
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[2] = dVar6;
  return __return_storage_ptr__;
}

Assistant:

Vector3d CollectiveDipoleDisplacement::calcCorrVal(int frame1, int frame2) {
    Vector3d diff;
    RealType dcm, dtot, drot;
    diff = CRcm_[frame2] - CRcm_[frame1];
    dcm  = diff.lengthSquare();
    diff = CRtot_[frame2] - CRtot_[frame1];
    dtot = diff.lengthSquare();
    diff = CRrot_[frame2] - CRrot_[frame1];
    drot = diff.lengthSquare();

    return Vector3d(dcm, dtot, drot);
  }